

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  int iVar1;
  secp256k1_fe *psVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  secp256k1_modinv64_modinfo *modinfo;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  secp256k1_modinv64_modinfo *modinfo_00;
  long *extraout_RDX_02;
  long lVar11;
  long lVar12;
  secp256k1_fe *psVar13;
  secp256k1_modinv64_modinfo *unaff_RBP;
  ulong uVar14;
  secp256k1_fe *psVar15;
  secp256k1_fe *a;
  secp256k1_fe *psVar16;
  secp256k1_sha256 *psVar17;
  secp256k1_fe *psVar18;
  uint64_t *puVar19;
  long lVar20;
  secp256k1_fe *psVar21;
  secp256k1_fe *psVar22;
  uint64_t uVar23;
  secp256k1_fe *psVar24;
  secp256k1_fe *psVar25;
  long lVar26;
  secp256k1_fe *psVar27;
  secp256k1_fe *psVar28;
  secp256k1_fe *psVar29;
  bool bVar30;
  byte bVar31;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 d;
  secp256k1_fe tmp;
  secp256k1_fe sStack_2c8;
  secp256k1_fe *psStack_298;
  secp256k1_sha256 *psStack_290;
  uchar auStack_284 [4];
  secp256k1_sha256 sStack_280;
  secp256k1_fe *psStack_218;
  secp256k1_fe *psStack_210;
  secp256k1_fe *psStack_208;
  int iStack_1fc;
  secp256k1_fe *psStack_1f8;
  long lStack_1f0;
  long lStack_1e8;
  long lStack_1e0;
  secp256k1_fe *psStack_1d8;
  secp256k1_fe *psStack_1d0;
  secp256k1_fe *psStack_1c8;
  secp256k1_fe *psStack_1c0;
  secp256k1_fe *psStack_1b8;
  secp256k1_fe *psStack_1b0;
  uint local_19c;
  secp256k1_fe *local_198;
  secp256k1_fe *local_190;
  long local_188;
  ulong local_180;
  ulong local_178;
  secp256k1_fe *local_170;
  secp256k1_fe local_168;
  secp256k1_fe local_138;
  secp256k1_fe local_108;
  secp256k1_modinv64_trans2x2 local_d8;
  undefined1 local_b8 [48];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  secp256k1_fe local_68;
  
  bVar31 = 0;
  psVar28 = (secp256k1_fe *)0xf000000000000;
  psStack_1b0 = (secp256k1_fe *)0x11aece;
  local_170 = r;
  secp256k1_fe_verify(x);
  local_188 = 0x1000003d1;
  uVar5 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar14 = (uVar5 >> 0x34) + x->n[1];
  uVar8 = (uVar14 >> 0x34) + x->n[2];
  uVar9 = (uVar8 >> 0x34) + x->n[3];
  uVar10 = (uVar9 >> 0x34) + (x->n[4] & 0xffffffffffff);
  local_178 = (uVar14 | uVar5 | uVar8 | uVar9) & 0xfffffffffffff | uVar10;
  local_180 = (uVar5 ^ 0x1000003d0) & uVar14 & uVar8 & uVar9 & (uVar10 ^ 0xf000000000000);
  psStack_1b0 = (secp256k1_fe *)0x11af48;
  secp256k1_fe_verify(x);
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  psVar13 = &local_68;
  psStack_1b0 = (secp256k1_fe *)0x11af77;
  local_190 = x;
  secp256k1_fe_normalize_var(psVar13);
  local_168.n[0] = (local_68.n[1] << 0x34 | local_68.n[0]) & 0x3fffffffffffffff;
  local_168.n[1] = (ulong)((uint)local_68.n[2] & 0xfffff) << 0x2a | local_68.n[1] >> 10;
  local_168.n[2] = (ulong)((uint)local_68.n[3] & 0x3fffffff) << 0x20 | local_68.n[2] >> 0x14;
  local_168.n[3] = (local_68.n[4] & 0xffffffffff) << 0x16 | local_68.n[3] >> 0x1e;
  local_168.n[4] = local_68.n[4] >> 0x28;
  local_b8._16_8_ = 0;
  local_b8._24_8_ = 0;
  local_b8._0_8_ = 0;
  local_b8._8_8_ = 0;
  local_b8._32_8_ = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_b8._40_4_ = 1;
  local_b8._44_4_ = 0;
  local_138.n[2] = 0;
  local_138.n[3] = 0;
  local_138.n[0] = -0x1000003d1;
  local_138.n[1] = 0;
  local_138.n[4] = 0x100;
  local_198 = (secp256k1_fe *)0x0;
  psVar27 = (secp256k1_fe *)0xffffffffffffffff;
  local_19c = 5;
  local_108.n[0] = local_168.n[0];
  local_108.n[1] = local_168.n[1];
  local_108.n[2] = local_168.n[2];
  local_108.n[3] = local_168.n[3];
  local_108.n[4] = local_168.n[4];
LAB_0011b08d:
  psVar25 = (secp256k1_fe *)local_138.n[0];
  psVar2 = (secp256k1_fe *)0x0;
  psVar21 = (secp256k1_fe *)0x0;
  psVar18 = (secp256k1_fe *)0x1;
  uVar7 = 0x3e;
  psVar15 = (secp256k1_fe *)0x1;
  uVar23 = local_108.n[0];
  psVar22 = (secp256k1_fe *)local_138.n[0];
  while( true ) {
    a = (secp256k1_fe *)(-1L << ((byte)uVar7 & 0x3f) | uVar23);
    modinfo = (secp256k1_modinv64_modinfo *)0x0;
    if (a != (secp256k1_fe *)0x0) {
      for (; ((ulong)a >> (long)modinfo & 1) == 0;
          modinfo = (secp256k1_modinv64_modinfo *)((long)(modinfo->modulus).v + 1)) {
      }
    }
    bVar3 = (byte)modinfo;
    psVar24 = (secp256k1_fe *)(uVar23 >> (bVar3 & 0x3f));
    psVar15 = (secp256k1_fe *)((long)psVar15 << (bVar3 & 0x3f));
    psVar2 = (secp256k1_fe *)((long)psVar2 << (bVar3 & 0x3f));
    psVar27 = (secp256k1_fe *)((long)psVar27 - (long)modinfo);
    uVar7 = uVar7 - (int)modinfo;
    if (uVar7 == 0) break;
    if (((ulong)psVar22 & 1) == 0) {
      psStack_1b0 = (secp256k1_fe *)0x11b601;
      secp256k1_fe_inv_var_cold_8();
LAB_0011b601:
      psStack_1b0 = (secp256k1_fe *)0x11b606;
      secp256k1_fe_inv_var_cold_7();
LAB_0011b606:
      psStack_1b0 = (secp256k1_fe *)0x11b60b;
      secp256k1_fe_inv_var_cold_1();
LAB_0011b60b:
      psStack_1b0 = (secp256k1_fe *)0x11b610;
      secp256k1_fe_inv_var_cold_2();
LAB_0011b610:
      psStack_1b0 = (secp256k1_fe *)0x11b615;
      secp256k1_fe_inv_var_cold_6();
      psVar24 = psVar22;
      goto LAB_0011b615;
    }
    if (((ulong)psVar24 & 1) == 0) goto LAB_0011b601;
    a = (secp256k1_fe *)((long)psVar2 * local_108.n[0] + (long)psVar15 * local_138.n[0]);
    modinfo = (secp256k1_modinv64_modinfo *)(ulong)(0x3e - uVar7);
    bVar3 = (byte)(0x3e - uVar7);
    psVar13 = (secp256k1_fe *)((long)psVar22 << (bVar3 & 0x3f));
    if (a != psVar13) goto LAB_0011b606;
    psVar13 = (secp256k1_fe *)((long)psVar18 * local_108.n[0] + (long)psVar21 * local_138.n[0]);
    a = (secp256k1_fe *)((long)psVar24 << (bVar3 & 0x3f));
    if (psVar13 != a) goto LAB_0011b60b;
    modinfo = (secp256k1_modinv64_modinfo *)((long)psVar27[-0x10].n + 0x16);
    if (modinfo < (secp256k1_modinv64_modinfo *)0xfffffffffffffa2d) goto LAB_0011b610;
    iVar1 = (int)psVar24;
    if ((long)psVar27 < 0) {
      psVar27 = (secp256k1_fe *)-(long)psVar27;
      uVar4 = (int)psVar27 + 1;
      if ((int)uVar7 <= (int)uVar4) {
        uVar4 = uVar7;
      }
      modinfo = (secp256k1_modinv64_modinfo *)(ulong)uVar4;
      a = (secp256k1_fe *)(ulong)(uVar4 - 0x3f);
      if (0xffffffc1 < uVar4 - 0x3f) {
        psVar29 = (secp256k1_fe *)-(long)psVar2;
        unaff_RBP = (secp256k1_modinv64_modinfo *)-(long)psVar15;
        psVar16 = (secp256k1_fe *)-(long)psVar22;
        psVar13 = (secp256k1_fe *)
                  ((ulong)(0x3fL << (-(char)uVar4 & 0x3fU)) >> (-(char)uVar4 & 0x3fU));
        uVar4 = (iVar1 * iVar1 + 0x3e) * iVar1 * (int)psVar16 & (uint)psVar13;
        psVar2 = psVar18;
        psVar15 = psVar21;
        psVar28 = psVar29;
        goto LAB_0011b1e7;
      }
      goto LAB_0011b61f;
    }
    uVar4 = (int)psVar27 + 1;
    if ((int)uVar7 <= (int)uVar4) {
      uVar4 = uVar7;
    }
    modinfo = (secp256k1_modinv64_modinfo *)(ulong)uVar4;
    a = (secp256k1_fe *)(ulong)(uVar4 - 0x3f);
    if (uVar4 - 0x3f < 0xffffffc2) goto LAB_0011b61a;
    psVar13 = (secp256k1_fe *)((ulong)(0xfL << (-(char)uVar4 & 0x3fU)) >> (-(char)uVar4 & 0x3fU));
    uVar4 = -(iVar1 * (((int)psVar22 * 2 + 2U & 8) + (int)psVar22)) & (uint)psVar13;
    unaff_RBP = (secp256k1_modinv64_modinfo *)psVar21;
    psVar29 = psVar18;
    psVar16 = psVar24;
    psVar24 = psVar22;
LAB_0011b1e7:
    uVar5 = (ulong)uVar4;
    a = (secp256k1_fe *)(uVar5 * (long)psVar24);
    uVar23 = (long)a->n + (long)psVar16->n;
    psVar21 = (secp256k1_fe *)((long)((secp256k1_fe *)unaff_RBP)->n + (long)psVar15 * uVar5);
    modinfo = (secp256k1_modinv64_modinfo *)(uVar5 * (long)psVar2);
    psVar18 = (secp256k1_fe *)((long)(modinfo->modulus).v + (long)psVar29->n);
    psVar22 = psVar24;
    if ((uVar23 & (ulong)psVar13) != 0) {
LAB_0011b615:
      psStack_1b0 = (secp256k1_fe *)0x11b61a;
      secp256k1_fe_inv_var_cold_4();
      psVar22 = psVar24;
LAB_0011b61a:
      psStack_1b0 = (secp256k1_fe *)0x11b61f;
      secp256k1_fe_inv_var_cold_3();
LAB_0011b61f:
      psStack_1b0 = (secp256k1_fe *)0x11b624;
      secp256k1_fe_inv_var_cold_5();
      goto LAB_0011b624;
    }
  }
  a = (secp256k1_fe *)((long)psVar2 * (long)psVar21);
  modinfo = SUB168(SEXT816((long)psVar2) * SEXT816((long)psVar21),8);
  psStack_1d0 = (secp256k1_fe *)local_138.n[0];
  local_d8.u = (int64_t)psVar15;
  local_d8.v = (int64_t)psVar2;
  local_d8.q = (int64_t)psVar21;
  local_d8.r = (int64_t)psVar18;
  if ((long)psVar15 * (long)psVar18 - (long)a != 0x4000000000000000 ||
      SUB168(SEXT816((long)psVar15) * SEXT816((long)psVar18),8) - (long)modinfo !=
      (ulong)((secp256k1_fe *)((long)psVar15 * (long)psVar18) < a)) goto LAB_0011b660;
  psStack_1b0 = (secp256k1_fe *)0x11b26d;
  secp256k1_modinv64_update_de_62
            ((secp256k1_modinv64_signed62 *)local_b8,
             (secp256k1_modinv64_signed62 *)(local_b8 + 0x28),&local_d8,modinfo);
  uVar7 = local_19c;
  psVar28 = &local_138;
  psVar13 = (secp256k1_fe *)(ulong)local_19c;
  psVar15 = (secp256k1_fe *)(ulong)local_19c;
  unaff_RBP = &secp256k1_const_modinfo_fe;
  modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
  psStack_1b0 = (secp256k1_fe *)0x11b291;
  a = psVar28;
  iVar1 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar28,local_19c,
                     &secp256k1_const_modinfo_fe.modulus,-1);
  psVar22 = local_198;
  psVar25 = &local_108;
  if (0 < iVar1) {
    modinfo = (secp256k1_modinv64_modinfo *)0x1;
    psVar15 = (secp256k1_fe *)(ulong)uVar7;
    psStack_1b0 = (secp256k1_fe *)0x11b2b8;
    a = psVar28;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar1) goto LAB_0011b629;
    psVar15 = (secp256k1_fe *)(ulong)uVar7;
    modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    psStack_1b0 = (secp256k1_fe *)0x11b2d4;
    a = psVar25;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar25,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar1 < 1) goto LAB_0011b62e;
    modinfo = (secp256k1_modinv64_modinfo *)0x1;
    psVar15 = (secp256k1_fe *)(ulong)uVar7;
    psStack_1b0 = (secp256k1_fe *)0x11b2ee;
    a = psVar25;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar25,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar1) goto LAB_0011b633;
    psStack_1b0 = (secp256k1_fe *)0x11b30b;
    secp256k1_modinv64_update_fg_62_var
              (uVar7,(secp256k1_modinv64_signed62 *)psVar28,(secp256k1_modinv64_signed62 *)psVar25,
               &local_d8);
    if (local_108.n[0] == 0) {
      if (1 < (int)uVar7) {
        uVar5 = 1;
        uVar8 = 0;
        do {
          uVar8 = uVar8 | local_108.n[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar7 != uVar5);
        if (uVar8 != 0) goto LAB_0011b341;
      }
      a = &local_108;
      psVar15 = (secp256k1_fe *)(ulong)uVar7;
      modinfo = (secp256k1_modinv64_modinfo *)0x0;
      psStack_1b0 = (secp256k1_fe *)0x11b437;
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a,uVar7,&SECP256K1_SIGNED62_ONE,0);
      if (iVar1 != 0) goto LAB_0011b651;
      psStack_1b0 = (secp256k1_fe *)0x11b459;
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&local_138,uVar7,&SECP256K1_SIGNED62_ONE,-1)
      ;
      modinfo_00 = extraout_RDX;
      if (iVar1 != 0) {
        psStack_1b0 = (secp256k1_fe *)0x11b475;
        iVar1 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)&local_138,uVar7,&SECP256K1_SIGNED62_ONE,1
                          );
        modinfo_00 = extraout_RDX_00;
        if (iVar1 != 0) {
          a = &local_168;
          psVar15 = (secp256k1_fe *)0x5;
          modinfo = (secp256k1_modinv64_modinfo *)0x0;
          psStack_1b0 = (secp256k1_fe *)0x11b491;
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar1 != 0) goto LAB_0011b65b;
          a = (secp256k1_fe *)local_b8;
          psVar15 = (secp256k1_fe *)0x5;
          modinfo = (secp256k1_modinv64_modinfo *)0x0;
          psStack_1b0 = (secp256k1_fe *)0x11b4b4;
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar1 != 0) goto LAB_0011b65b;
          a = &local_138;
          modinfo = (secp256k1_modinv64_modinfo *)0x1;
          psVar15 = (secp256k1_fe *)(ulong)uVar7;
          psStack_1b0 = (secp256k1_fe *)0x11b4d4;
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a,uVar7,
                             &secp256k1_const_modinfo_fe.modulus,1);
          modinfo_00 = extraout_RDX_01;
          if (iVar1 != 0) goto LAB_0011b65b;
        }
      }
      psStack_1b0 = (secp256k1_fe *)0x11b4f4;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)local_b8,local_168.n[(long)(int)uVar7 + 5],
                 modinfo_00);
      psVar13 = local_170;
      local_168.n[4] = local_b8._32_8_;
      local_168.n[2] = local_b8._16_8_;
      local_168.n[3] = local_b8._24_8_;
      local_168.n[0] = local_b8._0_8_;
      local_168.n[1] = local_b8._8_8_;
      psStack_1b0 = (secp256k1_fe *)0x11b51c;
      secp256k1_fe_from_signed62(local_170,(secp256k1_modinv64_signed62 *)&local_168);
      psVar13->magnitude = (uint)(0 < local_190->magnitude);
      psVar13->normalized = 1;
      psStack_1b0 = (secp256k1_fe *)0x11b53c;
      secp256k1_fe_verify(psVar13);
      uVar8 = (psVar13->n[4] >> 0x30) * local_188 + psVar13->n[0];
      uVar5 = (uVar8 >> 0x34) + psVar13->n[1];
      uVar9 = (uVar5 >> 0x34) + psVar13->n[2];
      uVar10 = (uVar9 >> 0x34) + psVar13->n[3];
      psVar15 = (secp256k1_fe *)((uVar10 >> 0x34) + (psVar13->n[4] & 0xffffffffffff));
      a = (secp256k1_fe *)
          ((uVar8 ^ 0x1000003d0) & uVar5 & uVar9 & uVar10 & ((ulong)psVar15 ^ 0xf000000000000));
      bVar30 = a == (secp256k1_fe *)0xfffffffffffff ||
               ((uVar5 | uVar8 | uVar9 | uVar10) & 0xfffffffffffff) == 0 &&
               psVar15 == (secp256k1_fe *)0x0;
      modinfo = (secp256k1_modinv64_modinfo *)
                CONCAT71((int7)(((ulong)psVar15 ^ 0xf000000000000) >> 8),bVar30);
      if ((local_180 != 0xfffffffffffff && local_178 != 0) != bVar30) {
        secp256k1_fe_verify(psVar13);
        return;
      }
      goto LAB_0011b656;
    }
LAB_0011b341:
    lVar6 = (long)(int)uVar7;
    uVar5 = local_168.n[lVar6 + 5];
    modinfo = (secp256k1_modinv64_modinfo *)local_138.n[lVar6 + 5];
    a = (secp256k1_fe *)((long)uVar5 >> 0x3f ^ uVar5 | lVar6 + -2 >> 0x3f);
    psVar15 = (secp256k1_fe *)((long)modinfo >> 0x3f ^ (ulong)modinfo | (ulong)a);
    if (psVar15 == (secp256k1_fe *)0x0) {
      psVar13 = (secp256k1_fe *)(ulong)(uVar7 - 1);
      local_168.n[lVar6 + 4] = local_168.n[lVar6 + 4] | uVar5 << 0x3e;
      modinfo = (secp256k1_modinv64_modinfo *)((long)modinfo << 0x3e);
      local_138.n[lVar6 + 4] = local_138.n[lVar6 + 4] | (ulong)modinfo;
    }
    if ((int)psVar22 == 0xb) goto LAB_0011b638;
    uVar7 = (uint)psVar13;
    unaff_RBP = &secp256k1_const_modinfo_fe;
    modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    psStack_1b0 = (secp256k1_fe *)0x11b3b1;
    psVar15 = psVar13;
    a = psVar28;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar1 < 1) goto LAB_0011b63d;
    modinfo = (secp256k1_modinv64_modinfo *)0x1;
    psStack_1b0 = (secp256k1_fe *)0x11b3cb;
    psVar15 = psVar13;
    a = psVar28;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar1) goto LAB_0011b642;
    modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    psStack_1b0 = (secp256k1_fe *)0x11b3e7;
    psVar15 = psVar13;
    a = psVar25;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar25,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar1 < 1) goto LAB_0011b647;
    modinfo = (secp256k1_modinv64_modinfo *)0x1;
    psStack_1b0 = (secp256k1_fe *)0x11b401;
    psVar15 = psVar13;
    a = psVar25;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar25,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar1) goto LAB_0011b64c;
    local_198 = (secp256k1_fe *)(ulong)((int)psVar22 + 1);
    local_19c = uVar7;
    goto LAB_0011b08d;
  }
LAB_0011b624:
  psStack_1b0 = (secp256k1_fe *)0x11b629;
  secp256k1_fe_inv_var_cold_21();
LAB_0011b629:
  psStack_1b0 = (secp256k1_fe *)0x11b62e;
  secp256k1_fe_inv_var_cold_20();
LAB_0011b62e:
  psStack_1b0 = (secp256k1_fe *)0x11b633;
  secp256k1_fe_inv_var_cold_19();
LAB_0011b633:
  psStack_1b0 = (secp256k1_fe *)0x11b638;
  secp256k1_fe_inv_var_cold_18();
LAB_0011b638:
  psStack_1b0 = (secp256k1_fe *)0x11b63d;
  secp256k1_fe_inv_var_cold_14();
LAB_0011b63d:
  psStack_1b0 = (secp256k1_fe *)0x11b642;
  secp256k1_fe_inv_var_cold_13();
LAB_0011b642:
  psStack_1b0 = (secp256k1_fe *)0x11b647;
  secp256k1_fe_inv_var_cold_12();
LAB_0011b647:
  psStack_1b0 = (secp256k1_fe *)0x11b64c;
  secp256k1_fe_inv_var_cold_11();
LAB_0011b64c:
  psStack_1b0 = (secp256k1_fe *)0x11b651;
  secp256k1_fe_inv_var_cold_10();
LAB_0011b651:
  psStack_1b0 = (secp256k1_fe *)0x11b656;
  secp256k1_fe_inv_var_cold_15();
LAB_0011b656:
  psStack_1b0 = (secp256k1_fe *)0x11b65b;
  secp256k1_fe_inv_var_cold_17();
LAB_0011b65b:
  psStack_1b0 = (secp256k1_fe *)0x11b660;
  secp256k1_fe_inv_var_cold_16();
  psStack_1d0 = psVar25;
LAB_0011b660:
  psStack_1b0 = (secp256k1_fe *)secp256k1_modinv64_update_fg_62_var;
  secp256k1_fe_inv_var_cold_9();
  iVar1 = (int)a;
  psStack_1d8 = psVar13;
  psStack_1c8 = psVar22;
  psStack_1c0 = psVar27;
  psStack_1b8 = psVar28;
  psStack_1b0 = (secp256k1_fe *)unaff_RBP;
  if (iVar1 < 1) {
LAB_0011b90d:
    psStack_208 = (secp256k1_fe *)0x11b912;
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0011b912:
    psStack_208 = (secp256k1_fe *)0x11b917;
    secp256k1_modinv64_update_fg_62_var_cold_1();
    psVar22 = psVar27;
LAB_0011b917:
    psStack_208 = (secp256k1_fe *)0x11b91c;
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0011b91c:
    psStack_208 = (secp256k1_fe *)0x11b921;
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0011b921:
    psStack_208 = (secp256k1_fe *)0x11b926;
    secp256k1_modinv64_update_fg_62_var_cold_5();
    psVar27 = psVar22;
    psVar25 = psVar28;
  }
  else {
    lStack_1e0 = (modinfo->modulus).v[0];
    lStack_1e8 = (modinfo->modulus).v[1];
    uVar23 = psVar15->n[0];
    lVar6 = *extraout_RDX_02;
    psVar27 = (secp256k1_fe *)(uVar23 * lStack_1e0);
    lVar11 = SUB168(SEXT816((long)uVar23) * SEXT816(lStack_1e0),8);
    uVar8 = lVar6 * lStack_1e8;
    psVar13 = SUB168(SEXT816(lVar6) * SEXT816(lStack_1e8),8);
    uVar5 = (ulong)((secp256k1_fe *)~uVar8 < psVar27);
    lVar12 = (0x7fffffffffffffff - (long)psVar13) - lVar11;
    psVar25 = (secp256k1_fe *)~uVar8;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar13,lVar11) != SBORROW8(lVar12,uVar5)) ==
        (long)(lVar12 - uVar5) < 0 || (long)psVar13 < 0) {
      lStack_1f0 = (modinfo->modulus).v[2];
      psVar25 = (secp256k1_fe *)(modinfo->modulus).v[3];
      puVar19 = (uint64_t *)((long)psVar27->n + uVar8);
      psVar13 = (secp256k1_fe *)((long)psVar13->n + (ulong)CARRY8(uVar8,(ulong)psVar27) + lVar11);
      uVar8 = uVar23 * lStack_1f0;
      psVar27 = SUB168(SEXT816((long)uVar23) * SEXT816(lStack_1f0),8);
      uVar9 = lVar6 * (long)psVar25;
      lVar12 = SUB168(SEXT816(lVar6) * SEXT816((long)psVar25),8);
      uVar5 = (ulong)(-uVar9 - 1 < uVar8);
      lVar6 = (0x7fffffffffffffff - lVar12) - (long)psVar27;
      psStack_1f8 = psVar25;
      if ((SBORROW8(0x7fffffffffffffff - lVar12,(long)psVar27) != SBORROW8(lVar6,uVar5)) !=
          (long)(lVar6 - uVar5) < 0 && -1 < lVar12) goto LAB_0011b92b;
      lVar6 = (long)psVar27->n + (ulong)CARRY8(uVar9,uVar8) + lVar12;
      psVar28 = psVar25;
      if (((ulong)puVar19 & 0x3fffffffffffffff) != 0) goto LAB_0011b912;
      psVar22 = psVar27;
      if ((uVar9 + uVar8 & 0x3fffffffffffffff) != 0) goto LAB_0011b917;
      uVar5 = uVar9 + uVar8 >> 0x3e | lVar6 * 4;
      uVar8 = (ulong)puVar19 >> 0x3e | (long)psVar13 * 4;
      psVar22 = (secp256k1_fe *)(lVar6 >> 0x3e);
      psVar13 = (secp256k1_fe *)((long)psVar13 >> 0x3e);
      iStack_1fc = iVar1;
      if (iVar1 != 1) {
        a = (secp256k1_fe *)((ulong)a & 0xffffffff);
        psVar2 = (secp256k1_fe *)0x1;
        do {
          psVar27 = (secp256k1_fe *)psVar15->n[(long)psVar2];
          psVar28 = (secp256k1_fe *)((long)psVar27 * lStack_1e0 + uVar8);
          lVar11 = (long)psVar13->n +
                   (ulong)CARRY8((long)psVar27 * lStack_1e0,uVar8) +
                   SUB168(SEXT816((long)psVar27) * SEXT816(lStack_1e0),8);
          lVar6 = extraout_RDX_02[(long)psVar2];
          uVar8 = lVar6 * lStack_1e8;
          lVar12 = SUB168(SEXT816(lVar6) * SEXT816(lStack_1e8),8);
          if (-1 < lVar12) {
            psVar13 = (secp256k1_fe *)(-1 - uVar8);
            lVar20 = (0x7fffffffffffffff - lVar12) - lVar11;
            if ((SBORROW8(0x7fffffffffffffff - lVar12,lVar11) !=
                SBORROW8(lVar20,(ulong)(psVar13 < psVar28))) ==
                (long)(lVar20 - (ulong)(psVar13 < psVar28)) < 0) goto LAB_0011b7fc;
LAB_0011b903:
            psStack_208 = (secp256k1_fe *)0x11b908;
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0011b908:
            psStack_208 = (secp256k1_fe *)0x11b90d;
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_0011b90d;
          }
          lVar26 = (-0x8000000000000000 - lVar12) - (ulong)(uVar8 != 0);
          lVar20 = lVar11 - lVar26;
          psVar13 = (secp256k1_fe *)(lVar20 - (ulong)(psVar28 < (secp256k1_fe *)-uVar8));
          if ((SBORROW8(lVar11,lVar26) != SBORROW8(lVar20,(ulong)(psVar28 < (secp256k1_fe *)-uVar8))
              ) != (long)psVar13 < 0) goto LAB_0011b903;
LAB_0011b7fc:
          bVar30 = CARRY8((ulong)psVar28,uVar8);
          psVar28 = (secp256k1_fe *)((long)psVar28->n + uVar8);
          lVar12 = lVar11 + lVar12 + (ulong)bVar30;
          psVar13 = (secp256k1_fe *)((long)psVar27 * lStack_1f0 + uVar5);
          psVar27 = (secp256k1_fe *)
                    ((long)psVar22->n +
                    (ulong)CARRY8((long)psVar27 * lStack_1f0,uVar5) +
                    SUB168(SEXT816((long)psVar27) * SEXT816(lStack_1f0),8));
          uVar5 = lVar6 * (long)psVar25;
          lVar6 = SUB168(SEXT816(lVar6) * SEXT816((long)psVar25),8);
          if (lVar6 < 0) {
            lVar20 = (-0x8000000000000000 - lVar6) - (ulong)(uVar5 != 0);
            lVar11 = (long)psVar27 - lVar20;
            if ((SBORROW8((long)psVar27,lVar20) !=
                SBORROW8(lVar11,(ulong)(psVar13 < (secp256k1_fe *)-uVar5))) !=
                (long)(lVar11 - (ulong)(psVar13 < (secp256k1_fe *)-uVar5)) < 0) goto LAB_0011b908;
          }
          else {
            uVar8 = (ulong)((secp256k1_fe *)(-1 - uVar5) < psVar13);
            lVar11 = (0x7fffffffffffffff - lVar6) - (long)psVar27;
            if ((SBORROW8(0x7fffffffffffffff - lVar6,(long)psVar27) != SBORROW8(lVar11,uVar8)) !=
                (long)(lVar11 - uVar8) < 0) goto LAB_0011b908;
          }
          puVar19 = (uint64_t *)((long)psVar13->n + uVar5);
          lVar6 = (long)psVar27->n + (ulong)CARRY8((ulong)psVar13,uVar5) + lVar6;
          uVar8 = lVar12 * 4 | (ulong)psVar28 >> 0x3e;
          psVar15->n[(long)((long)&psVar2[-1].normalized + 3)] =
               (uint64_t)((ulong)psVar28 & 0x3fffffffffffffff);
          uVar5 = lVar6 * 4 | (ulong)puVar19 >> 0x3e;
          extraout_RDX_02[(long)((long)&psVar2[-1].normalized + 3)] =
               (ulong)puVar19 & 0x3fffffffffffffff;
          psVar2 = (secp256k1_fe *)((long)psVar2->n + 1);
          psVar22 = (secp256k1_fe *)(lVar6 >> 0x3e);
          psVar13 = (secp256k1_fe *)(lVar12 >> 0x3e);
          psVar28 = (secp256k1_fe *)((ulong)psVar28 & 0x3fffffffffffffff);
        } while (a != psVar2);
      }
      if ((long)psVar13->n + ((ulong)(0x7fffffffffffffff < uVar8) - 1) != -1) goto LAB_0011b91c;
      psVar15->n[(long)iVar1 + -1] = uVar8;
      psVar22 = (secp256k1_fe *)((long)psVar22->n + ((ulong)(0x7fffffffffffffff < uVar5) - 1));
      if (psVar22 == (secp256k1_fe *)0xffffffffffffffff) {
        extraout_RDX_02[(long)iVar1 + -1] = uVar5;
        return;
      }
      goto LAB_0011b921;
    }
  }
  psStack_208 = (secp256k1_fe *)0x11b92b;
  secp256k1_modinv64_update_fg_62_var_cold_8();
LAB_0011b92b:
  psStack_208 = (secp256k1_fe *)secp256k1_ellswift_prng;
  secp256k1_modinv64_update_fg_62_var_cold_7();
  psVar17 = &sStack_280;
  psStack_218 = psVar13;
  psStack_210 = psVar27;
  psStack_208 = psVar25;
  for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(uint64_t *)psVar17->s = psVar15->n[0];
    psVar15 = (secp256k1_fe *)((long)psVar15 + (ulong)bVar31 * -0x10 + 8);
    psVar17 = (secp256k1_sha256 *)((long)psVar17 + (ulong)bVar31 * -0x10 + 8);
  }
  uVar5 = sStack_280.bytes >> 6;
  psStack_290 = (secp256k1_sha256 *)0x11b968;
  secp256k1_sha256_write(&sStack_280,auStack_284,4);
  psStack_290 = (secp256k1_sha256 *)0x11b973;
  psVar17 = &sStack_280;
  secp256k1_sha256_finalize(&sStack_280,(uchar *)a);
  if (sStack_280.bytes >> 6 != uVar5 + 1) {
    psStack_290 = (secp256k1_sha256 *)secp256k1_ge_x_on_curve_var;
    secp256k1_ellswift_prng_cold_1();
    psStack_298 = a;
    psStack_290 = &sStack_280;
    secp256k1_fe_sqr(&sStack_2c8,(secp256k1_fe *)psVar17);
    secp256k1_fe_mul(&sStack_2c8,&sStack_2c8,(secp256k1_fe *)psVar17);
    secp256k1_fe_verify(&sStack_2c8);
    sStack_2c8.n[0] = sStack_2c8.n[0] + 2;
    sStack_2c8.magnitude = sStack_2c8.magnitude + 1;
    sStack_2c8.normalized = 0;
    secp256k1_fe_verify(&sStack_2c8);
    secp256k1_fe_is_square_var(&sStack_2c8);
    return;
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv_var(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}